

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

errr finish_parse_artifact(parser *p)

{
  byte *pbVar1;
  ushort uVar2;
  void *pvVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  curse *pcVar7;
  artifact *paVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  void *pvVar11;
  object *poVar12;
  object_kind *poVar13;
  uint16_t uVar14;
  bitflag *pbVar15;
  ulong uVar16;
  long lVar17;
  
  z_info->a_max = 0;
  pvVar11 = parser_priv(p);
  if (pvVar11 != (void *)0x0) {
    uVar14 = z_info->a_max;
    do {
      uVar14 = uVar14 + 1;
      pvVar11 = *(void **)((long)pvVar11 + 0x18);
    } while (pvVar11 != (void *)0x0);
    z_info->a_max = uVar14;
  }
  a_info = (artifact *)mem_zalloc((ulong)((uint)z_info->a_max * 0x140) + 0x140);
  aup_info = (artifact_upkeep *)mem_zalloc((ulong)z_info->a_max * 8 + 8);
  uVar2 = z_info->a_max;
  uVar16 = (ulong)uVar2;
  pvVar11 = parser_priv(p);
  if (pvVar11 != (void *)0x0) {
    lVar17 = (ulong)(((uint)uVar2 * 4 + (uint)uVar2) * 0x40) + 0x140;
    do {
      if ((long)uVar16 < 1) {
        __assert_fail("aidx > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-init.c"
                      ,0xcc0,"errr finish_parse_artifact(struct parser *)");
      }
      memcpy(a_info[-1].flags + lVar17 + -0x3c,pvVar11,0x140);
      *(uint32_t *)((long)a_info + lVar17 + -0x130) = (uint32_t)uVar16;
      pvVar3 = *(void **)((long)pvVar11 + 0x18);
      pbVar15 = a_info->flags + lVar17 + -0x3c;
      if ((long)(ulong)z_info->a_max <= (long)uVar16) {
        pbVar15 = (bitflag *)0x0;
      }
      *(bitflag **)((long)a_info + lVar17 + -0x128) = pbVar15;
      mem_free(pvVar11);
      aup_info[uVar16].aidx = (uint32_t)uVar16;
      uVar16 = uVar16 - 1;
      pvVar11 = pvVar3;
      lVar17 = lVar17 + -0x140;
    } while (pvVar3 != (void *)0x0);
  }
  z_info->a_max = z_info->a_max + 1;
  wVar9 = tval_find_idx("none");
  wVar10 = lookup_sval(wVar9,"<unknown item>");
  unknown_item_kind = lookup_kind(wVar9,wVar10);
  wVar10 = lookup_sval(wVar9,"<unknown treasure>");
  unknown_gold_kind = lookup_kind(wVar9,wVar10);
  wVar10 = lookup_sval(wVar9,"<pile>");
  pile_kind = lookup_kind(wVar9,wVar10);
  wVar10 = lookup_sval(wVar9,"<curse object>");
  curse_object_kind = lookup_kind(wVar9,wVar10);
  wVar9 = tval_find_idx("none");
  wVar9 = lookup_sval(wVar9,"<curse object>");
  if (1 < z_info->curse_max) {
    uVar16 = 1;
    lVar17 = 0x50;
    do {
      pcVar7 = curses;
      puVar4 = *(undefined8 **)(curses->conflict_flags + lVar17 + -0x28);
      *puVar4 = curse_object_kind;
      *(char *)((long)puVar4 + 0x3d) = (char)wVar9;
      if (puVar4[5] == 0) {
        poVar12 = object_new();
        *(object **)(*(long *)(pcVar7->conflict_flags + lVar17 + -0x28) + 0x28) = poVar12;
      }
      puVar4 = *(undefined8 **)(*(long *)(pcVar7->conflict_flags + lVar17 + -0x28) + 0x28);
      *puVar4 = curse_object_kind;
      *(char *)(*(long *)(*(long *)(curses->conflict_flags + lVar17 + -0x28) + 0x28) + 0x3d) =
           (char)wVar9;
      pbVar1 = (byte *)((long)puVar4 + 299);
      *pbVar1 = *pbVar1 | 2;
      uVar16 = uVar16 + 1;
      lVar17 = lVar17 + 0x38;
    } while (uVar16 < z_info->curse_max);
  }
  if (1 < z_info->a_max) {
    uVar16 = 1;
    lVar17 = 0x260;
    do {
      paVar8 = a_info;
      poVar13 = lookup_kind(*(wchar_t *)((long)a_info + lVar17 + -0x100),
                            *(wchar_t *)((long)a_info + lVar17 + -0xfc));
      if ((uint)z_info->ordinary_kind_max < poVar13->kidx) {
        poVar13->level = *(wchar_t *)(paVar8->flags + lVar17 + -0x6c);
        poVar13->effect = *(effect **)(paVar8->flags + lVar17 + -0x4c);
        poVar13->effect_msg = *(char **)(paVar8->flags + lVar17 + -0x44);
        if (poVar13->tval != L'\x13') {
          uVar5 = *(undefined8 *)(paVar8->flags + lVar17 + -0x3c);
          uVar6 = *(undefined8 *)(paVar8->flags + lVar17 + -0x3c + 8);
          (poVar13->time).base = (int)uVar5;
          (poVar13->time).dice = (int)((ulong)uVar5 >> 0x20);
          (poVar13->time).sides = (int)uVar6;
          (poVar13->time).m_bonus = (int)((ulong)uVar6 >> 0x20);
        }
      }
      uVar16 = uVar16 + 1;
      lVar17 = lVar17 + 0x140;
    } while (uVar16 < z_info->a_max);
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_artifact(struct parser *p) {
	struct artifact *a, *n;
	int none, aidx;

	/* Scan the list for the max id */
	z_info->a_max = 0;
	a = parser_priv(p);
	while (a) {
		z_info->a_max++;
		a = a->next;
	}

	/* Allocate the direct access list and copy the data to it */
	a_info = mem_zalloc((z_info->a_max + 1) * sizeof(*a));
	aup_info = mem_zalloc((z_info->a_max + 1) * sizeof(*aup_info));
	aidx = z_info->a_max;
	for (a = parser_priv(p); a; a = n, aidx--) {
		assert(aidx > 0);

		memcpy(&a_info[aidx], a, sizeof(*a));
		a_info[aidx].aidx = aidx;
		n = a->next;
		a_info[aidx].next = (aidx < z_info->a_max) ?
			&a_info[aidx + 1] : NULL;
		mem_free(a);

		aup_info[aidx].aidx = aidx;
	}
	z_info->a_max += 1;

	/* Now we're done with object kinds, deal with object-like things... */
	none = tval_find_idx("none");
	unknown_item_kind = lookup_kind(none, lookup_sval(none, "<unknown item>"));
	unknown_gold_kind = lookup_kind(none,
									lookup_sval(none, "<unknown treasure>"));
	pile_kind = lookup_kind(none, lookup_sval(none, "<pile>"));
	curse_object_kind = lookup_kind(none, lookup_sval(none, "<curse object>"));
	write_curse_kinds();

	/* ..and fill in all object data */
	for (aidx = 1; aidx < z_info->a_max; aidx++) {
		struct artifact *art = &a_info[aidx];
		struct object_kind *kind = lookup_kind(art->tval, art->sval);
		if (kind->kidx > z_info->ordinary_kind_max) {
			kind->level = art->level;
			kind->effect = art->effect;
			kind->effect_msg = art->effect_msg;
			/*
			 * Timeout for a light already handled in
			 * parse_artifact_time().
			 */
			if (kind->tval != TV_LIGHT) {
				kind->time = art->time;
			}
		}
	}

	parser_destroy(p);
	return 0;
}